

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O3

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  Iterator *pIVar1;
  ulong *puVar2;
  long lVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                  ,0xb5,
                  "Iterator *leveldb::NewMergingIterator(const Comparator *, Iterator **, int)");
  }
  if (n == 1) {
    pIVar1 = *children;
  }
  else {
    if (n == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    pIVar1 = (Iterator *)operator_new(0x50);
    Iterator::Iterator(pIVar1);
    pIVar1->_vptr_Iterator = (_func_int **)&PTR__MergingIterator_001384b8;
    pIVar1[1]._vptr_Iterator = (_func_int **)comparator;
    uVar5 = (ulong)(uint)n;
    puVar2 = (ulong *)operator_new__(uVar5 * 0x20 + 8);
    *puVar2 = uVar5;
    lVar3 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar3 + 8) = 0;
      *(undefined1 *)((long)puVar2 + lVar3 + 0x10) = 0;
      *(char **)((long)puVar2 + lVar3 + 0x18) = "";
      *(undefined8 *)((long)puVar2 + lVar3 + 0x20) = 0;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 * 0x20 != lVar3);
    pIVar1[1].cleanup_head_.function = (CleanupFunction)(puVar2 + 1);
    *(int *)&pIVar1[1].cleanup_head_.arg1 = n;
    pIVar1[1].cleanup_head_.arg2 = (void *)0x0;
    *(undefined4 *)&pIVar1[1].cleanup_head_.next = 0;
    lVar3 = 0;
    uVar4 = 0;
    do {
      IteratorWrapper::Set
                ((IteratorWrapper *)(pIVar1[1].cleanup_head_.function + lVar3),children[uVar4]);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 != uVar4);
  }
  return pIVar1;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}